

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::Node::BeginChildren(Node *this,StreamWriterLE *s,bool binary,int indent)

{
  undefined3 in_register_00000011;
  ostringstream ss;
  string sStack_1a8;
  ostringstream local_188 [376];
  
  if (CONCAT31(in_register_00000011,binary) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::operator<<((ostream *)local_188," {");
    std::__cxx11::stringbuf::str();
    StreamWriter<false,_false>::PutString(s,&sStack_1a8);
    std::__cxx11::string::~string((string *)&sStack_1a8);
    std::__cxx11::ostringstream::~ostringstream(local_188);
  }
  return;
}

Assistant:

void FBX::Node::BeginChildren(
    Assimp::StreamWriterLE &s,
    bool binary, int indent
) {
    if (binary) {
        // nothing to do
    } else {
        std::ostringstream ss;
        BeginChildrenAscii(ss, indent);
        s.PutString(ss.str());
    }
}